

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOR<double>::MultiThread_Assemble
          (TPZStructMatrixOR<double> *this,TPZBaseMatrix *mat,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  undefined1 uVar1;
  undefined1 uVar2;
  ThreadData *this_00;
  TPZBaseMatrix *mat_00;
  TPZGuiInterface *this_01;
  TPZAutoPointer *in_RCX;
  TPZBaseMatrix *in_RDX;
  set<int,_std::less<int>,_std::allocator<int>_> *in_RSI;
  uint uVar3;
  long *in_RDI;
  int itr;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  int numthreads;
  ThreadData threaddata;
  TPZStructMatrix *myself;
  size_t in_stack_00000238;
  char *in_stack_00000240;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined7 in_stack_fffffffffffffe58;
  ThreadData *this_02;
  int local_174;
  vector<std::thread,_std::allocator<std::thread>_> local_170;
  int local_158;
  void *in_stack_ffffffffffffffd0;
  
  if (in_RDI == (long *)0x0) {
    this_00 = (ThreadData *)0x0;
  }
  else {
    this_00 = (ThreadData *)
              __dynamic_cast(in_RDI,&typeinfo,&::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  }
  this_02 = this_00;
  if (this_00 == (ThreadData *)0x0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZStructMatrixOR<double>::MultiThread_Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr,"Run-time error.Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_00000240,in_stack_00000238);
  }
  mat_00 = (TPZBaseMatrix *)::TPZStructMatrix::MaterialIds((TPZStructMatrix *)this_00);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
             (TPZAutoPointer<TPZGuiInterface> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  uVar1 = TPZStrMatParInterface::ComputeRhs
                    ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
  uVar3 = (uint)(byte)uVar1;
  ThreadData::ThreadData
            (this_02,(TPZStructMatrix *)CONCAT17(uVar1,in_stack_fffffffffffffe58),mat_00,in_RDX,
             in_RSI,(TPZAutoPointer<TPZGuiInterface> *)this_00,(bool)in_stack_fffffffffffffe37);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  local_158 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1d75012);
  uVar2 = ::TPZAutoPointer::operator_cast_to_bool(in_RCX);
  if ((bool)uVar2) {
    this_01 = TPZAutoPointer<TPZGuiInterface>::operator->((TPZAutoPointer<TPZGuiInterface> *)in_RCX)
    ;
    in_stack_fffffffffffffe27 = TPZGuiInterface::AmIKilled(this_01);
    if ((bool)in_stack_fffffffffffffe27) goto LAB_01d7517b;
  }
  for (local_174 = 0; local_174 < local_158; local_174 = local_174 + 1) {
    std::thread::thread<void*(&)(void*),TPZStructMatrixOR<double>::ThreadData*,void>
              ((thread *)this_02,
               (_func_void_ptr_void_ptr *)CONCAT17(uVar1,in_stack_fffffffffffffe58),
               (ThreadData **)mat_00);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (value_type *)CONCAT44(in_stack_fffffffffffffe1c,uVar3));
    std::thread::~thread((thread *)0x1d750fa);
  }
  ThreadData::ThreadAssembly(in_stack_ffffffffffffffd0);
  for (local_174 = 0; local_174 < local_158; local_174 = local_174 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_170,(long)local_174);
    std::thread::join();
  }
LAB_01d7517b:
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffe30));
  ThreadData::~ThreadData
            ((ThreadData *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  return;
}

Assistant:

void
TPZStructMatrixOR<TVar>::MultiThread_Assemble(TPZBaseMatrix & mat, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    if(!myself){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<"Run-time error.Aborting...\n";
        DebugStop();
    }
    ThreadData threaddata(myself,mat,rhs,myself->MaterialIds(),guiInterface,ComputeRhs());
    const int numthreads = this->fNumThreads;
    std::vector<std::thread> allthreads;
    int itr;
    if (guiInterface) {
        if (guiInterface->AmIKilled()) {
            return;
        }
    }
    for (itr = 0; itr < numthreads; itr++) {
      allthreads.push_back(std::thread(ThreadData::ThreadWork, &threaddata));
    }

    ThreadData::ThreadAssembly(&threaddata);

    for (itr = 0; itr < numthreads; itr++) {
      allthreads[itr].join();
    }

#ifdef PZ_LOG2
    if (loggerCheck.isDebugEnabled()) {
        std::stringstream sout;
        //stiffness.Print("Matriz de Rigidez: ",sout);
        mat.Print("Matriz de Rigidez: ", sout, EMathematicaInput);
        rhs.Print("Right Handside", sout, EMathematicaInput);
        LOGPZ_DEBUG(loggerCheck, sout.str())
    }
#endif
}